

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

string * __thiscall
Parameter<std::pair<int,int>>::getParamType_abi_cxx11_
          (string *__return_storage_ptr__,Parameter<std::pair<int,int>> *this)

{
  ParameterTraits<std::pair<int,int>>::getParamType_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getParamType() {
    return ParameterTraits<ParamType>::getParamType();
  }